

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubD::DumpTopology
          (ON_SubD *this,ON_2udex vertex_id_range,ON_2udex edge_id_range,ON_2udex face_id_range,
          ON_TextLog *text_log)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  ON_SubDTextureCoordinateType OVar4;
  ON_SubDTextureCoordinateType texture_coordinate_type;
  bool bVar5;
  LevelOfDetail level_of_detail;
  uint uVar6;
  uint uVar7;
  ON_SubDLevel *pOVar8;
  wchar_t *pwVar9;
  size_t size_in_bytes;
  size_t sVar10;
  ON_2udex *pOVar11;
  ON_2udex *pOVar12;
  ON_SubD *parent_subd;
  size_t i;
  ON__UINT64 OVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double __x;
  ON_wString OStack_1f8;
  ON_SubDLevelIterator lit;
  ON_2udex empty_id_range;
  ON_TextLogIndent indent1_3;
  ON_SubDEdgeIdIterator eidit;
  ON__UINT64 local_198;
  ON__UINT64 local_188;
  ON_SubDFaceIdIterator fidit;
  ON_wString local_148;
  ON_wString local_140;
  ON_wString local_138;
  ON_wString local_130;
  ON_wString local_128;
  element_type *local_120;
  ON_2udex local_118;
  ON_2udex local_110;
  ON_2udex local_108;
  ON_SubDEdgeSharpness subd_sharpness_range;
  ON_2udex vertex_id_range_local;
  ON_2udex face_id_range_local;
  ON_2udex edge_id_range_local;
  ON_SubDVertexIdIterator vidit;
  
  local_120 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  local_118 = vertex_id_range;
  local_110 = edge_id_range;
  local_108 = face_id_range;
  vertex_id_range_local = vertex_id_range;
  face_id_range_local = face_id_range;
  edge_id_range_local = edge_id_range;
  if (local_120 == (element_type *)0x0) {
    ON_TextLog::Print(text_log,L"SubD: Empty\n");
    return 0;
  }
  pOVar8 = local_120->m_active_level;
  if (pOVar8 == (ON_SubDLevel *)0x0) {
    pOVar8 = &ON_SubDLevel::Empty;
  }
  uVar6 = (local_120->m_levels).m_count;
  uVar1 = pOVar8->m_level_index;
  bVar3 = ON_TextLog::IsTextHash(text_log);
  if (bVar3) {
    local_188 = 0;
    OVar13 = 0;
    local_198 = 0;
  }
  else {
    peVar2 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar2 == (element_type *)0x0) {
      OVar13 = 0;
    }
    else {
      OVar13 = peVar2->RuntimeSerialNumber;
    }
    local_188 = GeometryContentSerialNumber(this);
    local_198 = RenderContentSerialNumber(this);
  }
  peVar2 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar2 == (element_type *)0x0) ||
     (pOVar8 = peVar2->m_active_level, pOVar8 == (ON_SubDLevel *)0x0)) {
    pOVar8 = &ON_SubDLevel::Empty;
  }
  if (uVar6 < 2) {
    ON_TextLog::Print(text_log,L"SubD[%lu]: %u vertices, %u edges, %u faces\n",OVar13,
                      (ulong)pOVar8->m_vertex_count,(ulong)pOVar8->m_edge_count,
                      (ulong)pOVar8->m_face_count);
  }
  else {
    ON_TextLog::Print(text_log,
                      L"SubD[%lu]: %u levels. Level %u is active (%u vertices, %u edges, %u faces).\n"
                      ,OVar13,(ulong)uVar6,(ulong)uVar1,(ulong)pOVar8->m_vertex_count,
                      (ulong)pOVar8->m_edge_count,(ulong)pOVar8->m_face_count);
  }
  subd_sharpness_range = (ON_SubDEdgeSharpness)0x0;
  uVar6 = SharpEdgeCount(this,&subd_sharpness_range);
  if (uVar6 != 0) {
    ON_TextLog::PushIndent(text_log);
    if (((subd_sharpness_range.m_edge_sharpness[0] < 0.0) ||
        (subd_sharpness_range.m_edge_sharpness[0] != subd_sharpness_range.m_edge_sharpness[1])) ||
       (4.0 < subd_sharpness_range.m_edge_sharpness[0])) {
      ON_TextLog::Print(text_log,L"%u sharp edges with end sharpnesses from %g to %g.\n",
                        (double)subd_sharpness_range.m_edge_sharpness[0],
                        (double)subd_sharpness_range.m_edge_sharpness[1],(ulong)uVar6);
    }
    else if (uVar6 == 1) {
      ON_TextLog::Print(text_log,L"1 sharp edge with end sharpness = %g.\n",
                        (double)subd_sharpness_range.m_edge_sharpness[0]);
    }
    else {
      ON_TextLog::Print(text_log,L"%u sharp edges with end sharpness = %g.\n",
                        (double)subd_sharpness_range.m_edge_sharpness[0],(ulong)uVar6);
    }
    ON_TextLog::PopIndent(text_log);
  }
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    SubDHash((ON_SubDHash *)&vidit,this,(&DAT_006c71c4)[lVar14],false);
    ON_SubDHash::Dump((ON_SubDHash *)&vidit,text_log);
  }
  if (bVar3) goto LAB_005d73c8;
  ON_TextLog::Print(text_log,L"Texture coordinate settings:\n");
  ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&fidit,text_log);
  OVar4 = TextureCoordinateType(this);
  texture_coordinate_type = TextureCoordinateType(this);
  TextureCoordinateTypeToString((ON_SubD *)&lit,texture_coordinate_type);
  pwVar9 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&lit);
  ON_TextLog::Print(text_log,L"TextureCoordinateType() = %ls\n",pwVar9);
  TextureMappingTag((ON_MappingTag *)&vidit,this,true);
  bVar3 = ::operator==(&ON_MappingTag::Unset,(ON_MappingTag *)&vidit);
  if (bVar3) {
    bVar5 = false;
LAB_005d6c9d:
    ON_TextLog::Print(text_log,L"Inactive TextureMappingTag()");
    pwVar9 = L" = ON_MappingTag::SurfaceParameterMapping\n";
    if (bVar3) {
      pwVar9 = L" = ON_MappingTag::Unset\n";
    }
    if ((bVar5 | bVar3) == 1) goto LAB_005d6ccc;
LAB_005d6cdb:
    ON_TextLog::Print(text_log,":\n");
    ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&eidit,text_log);
    ON_TextLog::Print(text_log,"m_mapping_type = ");
    if ((ulong)(uint)vidit.super_ON_FixedSizePoolIterator.m_it_element < 0xd) {
      ON_TextLog::Print(text_log,&DAT_006c7310 +
                                 *(int *)(&DAT_006c7310 +
                                         (ulong)(uint)vidit.super_ON_FixedSizePoolIterator.
                                                      m_it_element * 4));
    }
    ON_TextLog::PrintNewLine(text_log);
    ON_TextLog::Print(text_log,"m_mapping_id = ");
    ON_TextLog::Print(text_log,(ON_UUID *)&vidit);
    bVar3 = ::operator==((ON_UUID_struct *)&vidit,
                         &ON_MappingTag::SurfaceParameterMapping.m_mapping_id);
    if (bVar3) {
      ON_TextLog::Print(text_log," = ON_MappingTag::SurfaceParameterMapping.m_mapping_id");
    }
    ON_TextLog::PrintNewLine(text_log);
    ON_TextLog::Print(text_log,"m_mapping_crc = %08x\n",
                      (ulong)vidit.super_ON_FixedSizePoolIterator.m_it_element._4_4_);
    ON_TextLog::Print(text_log,"m_mesh_xform:\n");
    ON_TextLog::PushIndent(text_log);
    ON_TextLog::Print(text_log,(ON_Xform *)&vidit.m_subd_ref);
    ON_TextLog::PopIndent(text_log);
    ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&eidit);
  }
  else {
    bVar5 = ::operator==(&ON_MappingTag::SurfaceParameterMapping,(ON_MappingTag *)&vidit);
    if (OVar4 != FromMapping) goto LAB_005d6c9d;
    ON_TextLog::Print(text_log,L"TextureMappingTag()");
    if (!bVar5) goto LAB_005d6cdb;
    pwVar9 = L" = ON_MappingTag::SurfaceParameterMapping\n";
LAB_005d6ccc:
    ON_TextLog::Print(text_log,pwVar9);
  }
  TextureSettingsHash((ON_SHA1_Hash *)&vidit,this);
  ON_TextLog::Print(text_log,L"TextureSettingsHash() = ");
  ON_SHA1_Hash::Dump((ON_SHA1_Hash *)&vidit,text_log);
  ON_TextLog::PrintNewLine(text_log);
  FragmentTextureCoordinatesTextureSettingsHash((ON_SHA1_Hash *)&eidit,this);
  ON_TextLog::Print(text_log,L"FragmentTextureCoordinatesTextureSettingsHash() = ");
  bVar3 = ::operator==((ON_SHA1_Hash *)&vidit,(ON_SHA1_Hash *)&eidit);
  if (bVar3) {
    ON_TextLog::Print(text_log,L"TextureSettingsHash()");
  }
  else {
    ON_SHA1_Hash::Dump((ON_SHA1_Hash *)&eidit,text_log);
  }
  ON_TextLog::PrintNewLine(text_log);
  ON_wString::~ON_wString((ON_wString *)&lit);
  ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&fidit);
  ON_TextLog::Print(text_log,L"Per vertex color settings:\n");
  ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&fidit,text_log);
  ON_TextLog::Print(text_log,L"ColorsMappingTag() = ");
  ColorsMappingTag((ON_MappingTag *)&vidit,this);
  level_of_detail = ON_TextLog::DecreaseLevelOfDetail(text_log);
  ON_MappingTag::Dump((ON_MappingTag *)&vidit,text_log);
  ON_TextLog::SetLevelOfDetail(text_log,level_of_detail);
  FragmentColorsSettingsHash((ON_SHA1_Hash *)&eidit,this);
  ON_TextLog::Print(text_log,L"FragmentColorsSettingsHash() = ");
  ON_SHA1_Hash::Dump((ON_SHA1_Hash *)&eidit,text_log);
  ON_TextLog::PrintNewLine(text_log);
  ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&fidit);
  ON_TextLog::Print(text_log,L"Geometry content serial number = %lu\n",local_188);
  ON_TextLog::Print(text_log,L"Render content serial number = %lu\n",local_198);
  ON_TextLog::Print(text_log,"Heap use:\n");
  ON_TextLogIndent::ON_TextLogIndent((ON_TextLogIndent *)&vidit,text_log);
  size_in_bytes = SizeOfAllElements(this);
  ON_wString::ON_wString((ON_wString *)&fidit,L"Total = ");
  ON_wString::ToMemorySize((ON_wString *)&lit,size_in_bytes);
  ON_wString::operator+((ON_wString *)&eidit,(ON_wString *)&fidit);
  ON_wString::ON_wString((ON_wString *)&indent1_3,L".\n");
  ON_wString::operator+(&local_128,(ON_wString *)&eidit);
  ON_TextLog::PrintString(text_log,&local_128);
  ON_wString::~ON_wString(&local_128);
  ON_wString::~ON_wString((ON_wString *)&indent1_3);
  ON_wString::~ON_wString((ON_wString *)&eidit);
  ON_wString::~ON_wString((ON_wString *)&lit);
  ON_wString::~ON_wString((ON_wString *)&fidit);
  sVar10 = SizeOfAllMeshFragments(this);
  ON_wString::ON_wString((ON_wString *)&fidit,L"Mesh fragments = ");
  ON_wString::ToMemorySize((ON_wString *)&lit,sVar10);
  ON_wString::operator+((ON_wString *)&eidit,(ON_wString *)&fidit);
  ON_wString::ON_wString((ON_wString *)&indent1_3,L".\n");
  ON_wString::operator+(&local_130,(ON_wString *)&eidit);
  ON_TextLog::PrintString(text_log,&local_130);
  ON_wString::~ON_wString(&local_130);
  ON_wString::~ON_wString((ON_wString *)&indent1_3);
  ON_wString::~ON_wString((ON_wString *)&eidit);
  ON_wString::~ON_wString((ON_wString *)&lit);
  ON_wString::~ON_wString((ON_wString *)&fidit);
  sVar10 = SizeOfUnusedMeshFragments(this);
  ON_wString::ON_wString(&local_148,L"Reserved but ununsed = ");
  if (size_in_bytes == 0 || sVar10 == 0) {
    ON_wString::ToMemorySize(&OStack_1f8,0);
  }
  else {
    auVar18._8_4_ = (int)(sVar10 >> 0x20);
    auVar18._0_8_ = sVar10;
    auVar18._12_4_ = 0x45300000;
    auVar19._8_4_ = (int)(size_in_bytes >> 0x20);
    auVar19._0_8_ = size_in_bytes;
    auVar19._12_4_ = 0x45300000;
    __x = (((auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) * 100.0) /
          ((auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)size_in_bytes) - 4503599627370496.0));
    if (NAN(__x)) {
      ON_wString::ON_wString(&OStack_1f8,&ON_wString::EmptyString);
    }
    else {
      dVar16 = floor(__x);
      dVar17 = ceil(__x);
      ON_wString::ON_wString(&OStack_1f8,&ON_wString::EmptyString);
      uVar15 = -(ulong)(0.5 < __x - dVar16);
      dVar16 = (double)(~uVar15 & (ulong)dVar16 | (ulong)dVar17 & uVar15);
      if (((ABS(dVar16 - __x) < 0.1) && (dVar16 == 0.0)) && (!NAN(dVar16))) {
        ON_wString::operator=(&OStack_1f8,L" negligible");
      }
      bVar3 = ON_wString::IsEmpty(&OStack_1f8);
      if (bVar3) {
        pwVar9 = L"%g%% of total";
        if (dVar16 < 10.0) {
          pwVar9 = L"%0.1f%% of total)";
        }
        ON_wString::FormatToString((wchar_t *)&eidit,pwVar9);
        ON_wString::operator=(&OStack_1f8,(ON_wString *)&eidit);
        ON_wString::~ON_wString((ON_wString *)&eidit);
      }
      ON_wString::ON_wString((ON_wString *)&lit,L" (");
      ON_wString::ToMemorySize((ON_wString *)&indent1_3,sVar10);
      ON_wString::operator+((ON_wString *)&fidit,(ON_wString *)&lit);
      ON_wString::ON_wString((ON_wString *)&empty_id_range,L")");
      ON_wString::operator+((ON_wString *)&eidit,(ON_wString *)&fidit);
      ON_wString::operator+=(&OStack_1f8,(ON_wString *)&eidit);
      ON_wString::~ON_wString((ON_wString *)&eidit);
      ON_wString::~ON_wString((ON_wString *)&empty_id_range);
      ON_wString::~ON_wString((ON_wString *)&fidit);
      ON_wString::~ON_wString((ON_wString *)&indent1_3);
      ON_wString::~ON_wString((ON_wString *)&lit);
    }
  }
  ON_wString::operator+(&local_140,&local_148);
  ON_wString::ON_wString((ON_wString *)&eidit,L".\n");
  ON_wString::operator+(&local_138,&local_140);
  ON_TextLog::PrintString(text_log,&local_138);
  ON_wString::~ON_wString(&local_138);
  ON_wString::~ON_wString((ON_wString *)&eidit);
  ON_wString::~ON_wString(&local_140);
  ON_wString::~ON_wString(&OStack_1f8);
  ON_wString::~ON_wString(&local_148);
  ON_TextLogIndent::~ON_TextLogIndent((ON_TextLogIndent *)&vidit);
LAB_005d73c8:
  ON_TextLog::Print(text_log,L"Levels:\n");
  lit.m_levels = (local_120->m_levels).m_a;
  lit._8_8_ = ZEXT48((uint)(local_120->m_levels).m_count);
  ON_2udex::ON_2udex(&empty_id_range,0xffffffff,0);
  ON_SubDVertexIdIterator::ON_SubDVertexIdIterator(&vidit,this);
  ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator(&eidit,this);
  ON_SubDFaceIdIterator::ON_SubDFaceIdIterator(&fidit,this);
  pOVar8 = ON_SubDLevelIterator::First(&lit);
  uVar6 = 0;
  local_118 = (ON_2udex)((ulong)local_118 >> 0x20);
  local_110 = (ON_2udex)((ulong)local_110 >> 0x20);
  local_108 = (ON_2udex)((ulong)local_108 >> 0x20);
  while (pOVar8 != (ON_SubDLevel *)0x0) {
    ON_TextLogIndent::ON_TextLogIndent(&indent1_3,text_log);
    pOVar12 = &vertex_id_range_local;
    if ((local_118 == (ON_2udex)0x0) && (uVar1 != pOVar8->m_level_index)) {
      pOVar12 = &empty_id_range;
    }
    pOVar11 = &edge_id_range_local;
    if ((local_110 == (ON_2udex)0x0) && (uVar1 != pOVar8->m_level_index)) {
      pOVar11 = &empty_id_range;
    }
    parent_subd = (ON_SubD *)&face_id_range_local;
    if ((local_108 == (ON_2udex)0x0) && (uVar1 != pOVar8->m_level_index)) {
      parent_subd = (ON_SubD *)&empty_id_range;
    }
    uVar7 = ON_SubDLevel::DumpTopology
                      (pOVar8,parent_subd,(local_120->m_heap).m_max_vertex_id,
                       (local_120->m_heap).m_max_edge_id,(local_120->m_heap).m_max_face_id,*pOVar12,
                       *pOVar11,(ON_2udex)
                                (parent_subd->super_ON_Geometry).super_ON_Object._vptr_ON_Object,
                       &vidit,&eidit,&fidit,false,text_log);
    uVar6 = uVar6 + uVar7;
    ON_TextLogIndent::~ON_TextLogIndent(&indent1_3);
    pOVar8 = ON_SubDLevelIterator::Next(&lit);
  }
  ON_SubDRef::~ON_SubDRef(&fidit.m_subd_ref);
  ON_SubDRef::~ON_SubDRef(&eidit.m_subd_ref);
  ON_SubDRef::~ON_SubDRef(&vidit.m_subd_ref);
  return uVar6;
}

Assistant:

unsigned int ON_SubD::DumpTopology(
  ON_2udex vertex_id_range,
  ON_2udex edge_id_range,
  ON_2udex face_id_range,
  ON_TextLog& text_log
) const
{
  const class ON_SubDimple* subdimple = SubDimple();
  if (nullptr == subdimple)
  {
    text_log.Print(L"SubD: Empty\n");
    return 0;
  }

  const unsigned int level_count = LevelCount();
  const unsigned int active_level_index = ActiveLevel().m_level_index;

  const bool bIsTextHash = text_log.IsTextHash();

  // TextHash ignores settings that don't depend on 3dm file content.
  const ON__UINT64 runtime_sn = (bIsTextHash) ? 0 : RuntimeSerialNumber();
  const ON__UINT64 geometry_content_sn = (bIsTextHash) ? 0 : this->GeometryContentSerialNumber();
  const ON__UINT64 render_content_sn = (bIsTextHash) ? 0 : this->RenderContentSerialNumber();

  const unsigned subd_vertex_count = VertexCount();
  const unsigned subd_edge_count = EdgeCount();
  const unsigned subd_face_count = FaceCount();

  if (level_count > 1)
  {
    text_log.Print(L"SubD[%" PRIu64 "]: %u levels. Level %u is active (%u vertices, %u edges, %u faces).\n",
      runtime_sn,
      level_count,
      active_level_index,
      subd_vertex_count,
      subd_edge_count,
      subd_face_count
    );
  }
  else
  {
    text_log.Print(
      L"SubD[%" PRIu64 "]: %u vertices, %u edges, %u faces\n",
      runtime_sn,
      subd_vertex_count,
      subd_edge_count,
      subd_face_count
    );
  }

  ON_SubDEdgeSharpness subd_sharpness_range = ON_SubDEdgeSharpness::Smooth;
  const unsigned int subd_sharp_edge_count = SharpEdgeCount(subd_sharpness_range);
  if (subd_sharp_edge_count > 0)
  {
    text_log.PushIndent();
    if ( subd_sharpness_range.IsConstant() )
    {
      if (1 == subd_sharp_edge_count)
        text_log.Print(
          L"1 sharp edge with end sharpness = %g.\n",
          subd_sharpness_range[0]
        );
      else
        text_log.Print(
          L"%u sharp edges with end sharpness = %g.\n",
          subd_sharp_edge_count,
          subd_sharpness_range[0]
        );
    }
    else
    {
      text_log.Print(
        L"%u sharp edges with end sharpnesses from %g to %g.\n",
        subd_sharp_edge_count,
        subd_sharpness_range[0],
        subd_sharpness_range[1]
        );

    }
    text_log.PopIndent();
  }

  const ON_SubDHashType htype[] = {
    ON_SubDHashType::Topology,
    ON_SubDHashType::TopologyAndEdgeCreases,
    ON_SubDHashType::Geometry
  };

  for (size_t i = 0; i < sizeof(htype) / sizeof(htype[0]); ++i)
  {
    const ON_SubDHash h = this->SubDHash(htype[i], false);
    h.Dump(text_log);
  }


  if (false == bIsTextHash)
  {
    text_log.Print(L"Texture coordinate settings:\n");
    ON_TextLogIndent indent1(text_log);

    const ON_SubDTextureCoordinateType subd_texture_coordinate_type = this->TextureCoordinateType();
    const ON_wString subd_texture_coordinate_type_as_string = ON_SubD::TextureCoordinateTypeToString(this->TextureCoordinateType());
    text_log.Print(L"TextureCoordinateType() = %ls\n", static_cast<const wchar_t*>(subd_texture_coordinate_type_as_string));

    const bool bShowMappingTag
      = false == bIsTextHash
      || ON_SubDTextureCoordinateType::FromMapping == subd_texture_coordinate_type
      ;

    if (bShowMappingTag)
    {
      const ON_MappingTag mapping_tag = this->TextureMappingTag(true);

      const bool bUnsetMappingTag = ON_MappingTag::Unset == mapping_tag;

      const bool bSurfaceParameterMappingTag
        = false == bUnsetMappingTag
        && (
          ON_MappingTag::SurfaceParameterMapping == mapping_tag
          || (bIsTextHash && (ON_TextureMapping::TYPE::srfp_mapping == mapping_tag.m_mapping_type || ON_MappingTag::SurfaceParameterMapping.m_mapping_id == mapping_tag.m_mapping_id))
          )
        ;


      // NOTE: the mapping tag is only applied when subd_texture_coordinate_type = FromMapping
      if (ON_SubDTextureCoordinateType::FromMapping == subd_texture_coordinate_type && false == bUnsetMappingTag)
        text_log.Print(L"TextureMappingTag()");
      else
        text_log.Print(L"Inactive TextureMappingTag()");

      if (bUnsetMappingTag)
        text_log.Print(L" = ON_MappingTag::Unset\n");
      else if (bSurfaceParameterMappingTag)
        text_log.Print(L" = ON_MappingTag::SurfaceParameterMapping\n");
      else
      {
        text_log.Print(":\n");
        const ON_TextLogIndent indent2(text_log);
        text_log.Print("m_mapping_type = ");
        switch (mapping_tag.m_mapping_type)
        {
        case  ON_TextureMapping::TYPE::no_mapping:
          text_log.Print("none");
          break;
        case  ON_TextureMapping::TYPE::srfp_mapping:
          text_log.Print("srfp");
          break;
        case  ON_TextureMapping::TYPE::plane_mapping:
          text_log.Print("plane");
          break;
        case  ON_TextureMapping::TYPE::cylinder_mapping:
          text_log.Print("cylinder");
          break;
        case  ON_TextureMapping::TYPE::sphere_mapping:
          text_log.Print("sphere");
          break;
        case  ON_TextureMapping::TYPE::box_mapping:
          text_log.Print("box");
          break;
        case  ON_TextureMapping::TYPE::mesh_mapping_primitive:
          text_log.Print("mesh primitive");
          break;
        case  ON_TextureMapping::TYPE::srf_mapping_primitive:
          text_log.Print("srf primitive");
          break;
        case  ON_TextureMapping::TYPE::brep_mapping_primitive:
          text_log.Print("brep primitive");
          break;
        case  ON_TextureMapping::TYPE::ocs_mapping:
          text_log.Print("ocs");
          break;
        case  ON_TextureMapping::TYPE::false_colors:
          text_log.Print("false colors");
          break;
        case  ON_TextureMapping::TYPE::wcs_projection	:
          text_log.Print("wcs projection");
          break;
        case  ON_TextureMapping::TYPE::wcsbox_projection	:
          text_log.Print("wcs box projection");
          break;
        }
        text_log.PrintNewLine();
        text_log.Print("m_mapping_id = ");
        text_log.Print(mapping_tag.m_mapping_id);
        if (mapping_tag.m_mapping_id == ON_MappingTag::SurfaceParameterMapping.m_mapping_id)
          text_log.Print(" = ON_MappingTag::SurfaceParameterMapping.m_mapping_id");
        text_log.PrintNewLine();
        text_log.Print("m_mapping_crc = %08x\n", mapping_tag.m_mapping_crc);
        text_log.Print("m_mesh_xform:\n");
        text_log.PushIndent();
        text_log.Print(mapping_tag.m_mesh_xform);
        text_log.PopIndent();
      }
    }

    const ON_SHA1_Hash subd_texture_settings_hash = this->TextureSettingsHash();
    text_log.Print(L"TextureSettingsHash() = ");
    subd_texture_settings_hash.Dump(text_log);
    text_log.PrintNewLine();

    // runtime settings most recently used to set fragment texture coordinates.
    const ON_SHA1_Hash frament_texture_settings_hash = this->FragmentTextureCoordinatesTextureSettingsHash();
    text_log.Print(L"FragmentTextureCoordinatesTextureSettingsHash() = ");
    if (subd_texture_settings_hash == frament_texture_settings_hash)
      text_log.Print(L"TextureSettingsHash()");
    else
      frament_texture_settings_hash.Dump(text_log);
    text_log.PrintNewLine();
  }

  if (false == bIsTextHash)
  {
    text_log.Print(L"Per vertex color settings:\n");
    {
      ON_TextLogIndent indent1(text_log);
      text_log.Print(L"ColorsMappingTag() = ");
      const ON_MappingTag colors_tag = this->ColorsMappingTag();
      const ON_TextLog::LevelOfDetail lod = text_log.DecreaseLevelOfDetail();
      colors_tag.Dump(text_log);
      text_log.SetLevelOfDetail(lod);
      const ON_SHA1_Hash subd_fragment_color_settings_hash = this->FragmentColorsSettingsHash();
      text_log.Print(L"FragmentColorsSettingsHash() = ");
      subd_fragment_color_settings_hash.Dump(text_log);
      text_log.PrintNewLine();
    }
  }

  bool bIncludeSymmetrySet = false;

  if (false == bIsTextHash)
  {
    text_log.Print(L"Geometry content serial number = %" PRIu64 "\n", geometry_content_sn);
    text_log.Print(L"Render content serial number = %" PRIu64 "\n", render_content_sn);
    text_log.Print("Heap use:\n");
    {
      ON_TextLogIndent indent1(text_log);
      size_t sizeof_subd = this->SizeOfAllElements();
      text_log.PrintString(ON_wString(L"Total = ") + ON_wString::ToMemorySize(sizeof_subd) + ON_wString(L".\n"));
      const size_t sizeof_frags = this->SizeOfAllMeshFragments();
      text_log.PrintString(ON_wString(L"Mesh fragments = ") + ON_wString::ToMemorySize(sizeof_frags) + ON_wString(L".\n"));
      const size_t sizeof_frags_waste = this->SizeOfUnusedMeshFragments();
      text_log.PrintString(ON_wString(L"Reserved but ununsed = ")
        + Internal_DescribeWaste(sizeof_frags_waste, sizeof_subd)
        + ON_wString(L".\n"));
    }
  }

  text_log.Print(L"Levels:\n");

  ON_SubDLevelIterator lit(subdimple->LevelIterator());

  const ON_2udex empty_id_range(ON_UNSET_UINT_INDEX, 0);

  ON_SubDVertexIdIterator vidit(*this); 
  ON_SubDEdgeIdIterator eidit(*this); 
  ON_SubDFaceIdIterator fidit(*this);

  unsigned int error_count = 0;
  for (const ON_SubDLevel* level = lit.First(); nullptr != level; level = lit.Next())
  {
    ON_TextLogIndent indent1(text_log);
    if (nullptr == level)
      continue;
    ON_2udex level_vertex_id_range
      = (0 != vertex_id_range.j || active_level_index == level->m_level_index)
      ? vertex_id_range
      : empty_id_range;
    ON_2udex level_edge_id_range
      = (0 != edge_id_range.j || active_level_index == level->m_level_index)
      ? edge_id_range
      : empty_id_range;
    ON_2udex level_face_id_range
      = (0 != face_id_range.j || active_level_index == level->m_level_index)
      ? face_id_range
      : empty_id_range;

    error_count += level->DumpTopology(
      *this,
      subdimple->MaximumVertexId(),
      subdimple->MaximumEdgeId(),
      subdimple->MaximumFaceId(),
      level_vertex_id_range,
      level_edge_id_range, 
      level_face_id_range,
      vidit,
      eidit,
      fidit,
      bIncludeSymmetrySet,
      text_log);
  }

  return error_count;
}